

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::
async_upload_impl<(cinatra::upload_type_t)1,std::__cxx11::string,std::shared_ptr<std::ifstream>>
          (coro_http_client *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *uri,http_method method,
          shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> *source,
          req_content_type content_type,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *headers,uint64_t offset,int64_t content_length)

{
  pointer pcVar1;
  undefined8 *puVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  bool bVar9;
  uri_t *puVar10;
  type_conflict3 *ptVar11;
  type *ptVar12;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined4 in_ECX;
  undefined4 *puVar13;
  string_view *this_00;
  char **ppcVar14;
  char **this_01;
  char **this_02;
  char **this_03;
  pointer in_RSI;
  Handle in_RDI;
  coro_http_client *in_R8;
  undefined4 in_R9D;
  error_code eVar15;
  string_view sVar16;
  pointer in_stack_00000010;
  size_type in_stack_00000018;
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000050;
  bool *in_stack_00000058;
  size_t *in_stack_00000060;
  error_code *in_stack_00000068;
  coro_http_client *in_stack_00000070;
  http_method in_stack_000000e0;
  resp_data *in_stack_fffffffffffff6d8;
  coro_http_client *value;
  resp_data *prVar17;
  LazyPromise<cinatra::resp_data> *in_stack_fffffffffffff6e0;
  resp_data *in_stack_fffffffffffff6e8;
  anon_class_8_1_8991fb9c_for__M_tp in_stack_fffffffffffff6f0;
  coro_http_client *in_stack_fffffffffffff6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff700;
  allocator<char> *in_stack_fffffffffffff710;
  resp_data *in_stack_fffffffffffff718;
  coro_http_client *in_stack_fffffffffffff720;
  string *in_stack_fffffffffffff738;
  coro_http_client *in_stack_fffffffffffff740;
  timer_guard *in_stack_fffffffffffff748;
  duration in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff75c;
  undefined4 in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff764;
  undefined4 in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff804;
  resp_data *in_stack_fffffffffffff808;
  coro_http_client *in_stack_fffffffffffff810;
  int local_7dc;
  int local_7cc;
  int local_778;
  error_code *ec;
  string_view *source_00;
  coro_http_client *this_04;
  coro_http_client *this_05;
  uri_t *u;
  LazyPromiseBase *this_06;
  uri_t *ctx;
  uri_t *puVar18;
  http_method method_00;
  uri_t *u_00;
  basic_string_view<char,_std::char_traits<char>_> abStack_4d0 [3];
  coro_file *local_498;
  char *local_490;
  undefined4 local_488;
  undefined1 local_484;
  basic_string_view<char,_std::char_traits<char>_> abStack_480 [2];
  __enable_if_t<__assignable<std::error_code,_unsigned_long>(),_tuple<error_code_&,_unsigned_long_&>_&>
  local_460;
  allocator<char> local_409 [33];
  undefined8 local_3e8;
  byte local_3c9;
  int local_2e0;
  error_category *local_2d8;
  undefined4 local_2d0;
  undefined1 local_2cc;
  basic_string_view<char,_std::char_traits<char>_> abStack_2c8 [12];
  pointer local_208;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined4 local_4c;
  undefined4 local_3c;
  
  local_4c = in_R9D;
  local_3c = in_ECX;
  puVar10 = (uri_t *)operator_new(0x458,(nothrow_t *)&std::nothrow);
  if (puVar10 == (uri_t *)0x0) {
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
    get_return_object_on_allocation_failure();
    return (Lazy<cinatra::resp_data>)in_RDI.__handle_;
  }
  (puVar10->schema)._M_len =
       (size_t)
       async_upload_impl<(cinatra::upload_type_t)1,std::__cxx11::string,std::shared_ptr<std::ifstream>>
  ;
  (((string *)&(puVar10->schema)._M_str)->_M_dataplus)._M_p =
       (pointer)
       async_upload_impl<(cinatra::upload_type_t)1,std::__cxx11::string,std::shared_ptr<std::ifstream>>
  ;
  puVar13 = (undefined4 *)((long)&puVar10[9].schema._M_str + 4);
  this_00 = &puVar10[7].host;
  ppcVar14 = &puVar10[8].host._M_str;
  ec = (error_code *)&puVar10[8].port;
  source_00 = &puVar10[6].port;
  value = (coro_http_client *)((long)&puVar10[5].uinfo + 8);
  prVar17 = (resp_data *)&puVar10[8].port._M_str;
  this_05 = (coro_http_client *)&puVar10[8].path;
  u = (uri_t *)&puVar10[6].query;
  this_01 = &puVar10[8].path._M_str;
  this_02 = &puVar10[8].query._M_str;
  this_03 = &puVar10[8].fragment._M_str;
  this_06 = (LazyPromiseBase *)&puVar10->uinfo;
  puVar10[9].schema._M_len = (size_t)in_RSI;
  ctx = puVar10;
  puVar18 = puVar10;
  u_00 = puVar10;
  std::__cxx11::string::string
            (in_stack_fffffffffffff700,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f8);
  method_00 = (http_method)((ulong)puVar18 >> 0x20);
  *(undefined4 *)&puVar10[9].schema._M_str = local_3c;
  std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::shared_ptr
            ((shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
             in_stack_fffffffffffff6e0,
             (shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
             in_stack_fffffffffffff6d8);
  *puVar13 = local_4c;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff6e0,
                  (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff6d8);
  (((string *)&puVar10[8].schema._M_str)->_M_dataplus)._M_p = in_stack_00000010;
  puVar10[8].uinfo._M_len = in_stack_00000018;
  async_simple::coro::detail::LazyPromise<cinatra::resp_data>::LazyPromise
            (in_stack_fffffffffffff6e0);
  async_simple::coro::detail::LazyPromise<cinatra::resp_data>::get_return_object
            ((LazyPromise<cinatra::resp_data> *)in_stack_fffffffffffff6f8);
  async_simple::coro::detail::LazyPromiseBase::initial_suspend(this_06);
  bVar9 = std::suspend_always::await_ready
                    ((suspend_always *)
                     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)&puVar10[9].uinfo)->_M_local_buf + 5));
  if (!bVar9) {
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&ctx[9].uinfo)->_M_local_buf[4] = '\0';
    async_upload_impl(in_stack_fffffffffffff6f0.this,in_stack_fffffffffffff6e8);
    return (Lazy<cinatra::resp_data>)in_RDI.__handle_;
  }
  std::suspend_always::await_resume
            ((suspend_always *)
             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&puVar10[9].uinfo)->_M_local_buf + 5));
  pcVar1 = (pointer)ctx[9].schema._M_len;
  std::error_code::error_code((error_code *)in_stack_fffffffffffff6e0);
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)&puVar10[8].uinfo._M_str)->_M_allocated_capacity = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)&puVar10[9].uinfo)->_M_local_buf[6] = '\x01';
  *(undefined4 *)&puVar10[2].is_ssl = *puVar13;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f0.this);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6f0.this);
  puVar10[3].path._M_len = 0;
  std::error_code::error_code((error_code *)in_stack_fffffffffffff6e0);
  *(undefined4 *)&puVar10[4].fragment._M_str = 0;
  *(undefined1 *)((long)&puVar10[4].fragment._M_str + 4) = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&puVar10[4].is_ssl);
  std::span<cinatra::http_header,_18446744073709551615UL>::span
            ((span<cinatra::http_header,_18446744073709551615UL> *)0x690345);
  std::span<char,_18446744073709551615UL>::span((span<char,_18446744073709551615UL> *)0x690352);
  *(undefined8 *)(pcVar1 + 0x1008) = local_1f0;
  *(undefined8 *)(pcVar1 + 0x1010) = uStack_1e8;
  local_208 = pcVar1;
  std::shared_ptr<void>::
  shared_ptr<cinatra::coro_http_client::async_upload_impl<(cinatra::upload_type_t)1,std::__cxx11::string,std::shared_ptr<std::ifstream>>(std::__cxx11::string,cinatra::http_method,std::shared_ptr<std::ifstream>,cinatra::req_content_type,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,unsigned_long,long)::_lambda(auto:1)_1_>
            ((shared_ptr<void> *)in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
             in_stack_fffffffffffff6f0);
  handle_uri<std::__cxx11::string>
            (in_stack_fffffffffffff810,in_stack_fffffffffffff808,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
  ptVar11 = std::get<0ul,bool,cinatra::uri_t>((pair<bool,_cinatra::uri_t> *)0x6903c7);
  *ppcVar14 = ptVar11;
  ptVar12 = std::get<1ul,bool,cinatra::uri_t>((pair<bool,_cinatra::uri_t> *)0x6903e2);
  *(type **)ec = ptVar12;
  if ((**ppcVar14 & 1U) == 0) {
    eVar15 = std::make_error_code(0);
    local_2d8 = eVar15._M_cat;
    local_2e0 = eVar15._M_value;
    local_2d0 = 0x194;
    local_2cc = 0;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(abStack_2c8);
    std::span<cinatra::http_header,_18446744073709551615UL>::span
              ((span<cinatra::http_header,_18446744073709551615UL> *)0x690452);
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::return_value<cinatra::resp_data>
              (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
    local_778 = 3;
    goto LAB_006913f1;
  }
  check_source<std::shared_ptr<std::ifstream>>
            (in_stack_fffffffffffff720,in_stack_fffffffffffff718,
             (shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
             in_stack_fffffffffffff710);
  if (*(int *)&puVar10[4].fragment._M_str != 0) {
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::return_value<cinatra::resp_data>
              (in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
    local_778 = 3;
    goto LAB_006913f1;
  }
  handle_upload_header_with_chunked
            ((coro_http_client *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff6e0,
                  (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff6d8);
  this_04 = value;
  build_request_header<cinatra::req_context<std::__cxx11::string>>
            (in_R8,u_00,method_00,
             (req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)ctx,SUB81((ulong)this_06 >> 0x38,0),
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_RDI.__handle_);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x690620);
  std::
  __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x690634);
  bVar9 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffff6e8);
  if (bVar9) {
    puVar2 = *(undefined8 **)ec;
    puVar10[2].fragment._M_str = (char *)puVar2[0xe];
    sVar3 = puVar2[0xd];
    puVar10[2].query._M_str = (char *)puVar2[0xc];
    puVar10[2].fragment._M_len = sVar3;
    sVar3 = puVar2[0xb];
    puVar10[2].path._M_str = (char *)puVar2[10];
    puVar10[2].query._M_len = sVar3;
    sVar3 = puVar2[9];
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&puVar10[2].port._M_str)->_M_allocated_capacity = puVar2[8];
    puVar10[2].path._M_len = sVar3;
    uVar4 = *puVar2;
    uVar5 = puVar2[1];
    pcVar1 = (pointer)puVar2[2];
    sVar6 = puVar2[3];
    sVar7 = puVar2[4];
    sVar3 = puVar2[5];
    sVar8 = puVar2[7];
    puVar10[2].host._M_str = (char *)puVar2[6];
    puVar10[2].port._M_len = sVar8;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&puVar10[2].uinfo._M_str)->_M_allocated_capacity = sVar7;
    puVar10[2].host._M_len = sVar3;
    (((string *)&puVar10[2].schema._M_str)->_M_dataplus)._M_p = pcVar1;
    puVar10[2].uinfo._M_len = sVar6;
    *(undefined8 *)&puVar10[1].is_ssl = uVar4;
    puVar10[2].schema._M_len = uVar5;
    in_stack_fffffffffffff748 = (timer_guard *)puVar10[2].fragment._M_str;
    in_stack_fffffffffffff738 = (string *)puVar10[2].query._M_str;
    in_stack_fffffffffffff740 = (coro_http_client *)puVar10[2].fragment._M_len;
    in_stack_fffffffffffff718 =
         (resp_data *)
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&puVar10[2].port._M_str)->_M_allocated_capacity;
    in_stack_fffffffffffff720 = (coro_http_client *)puVar10[2].path._M_len;
    value = *(coro_http_client **)&puVar10[1].is_ssl;
    in_stack_fffffffffffff6e0 = (LazyPromise<cinatra::resp_data> *)puVar10[2].schema._M_len;
    in_stack_fffffffffffff6e8 =
         (resp_data *)(((string *)&puVar10[2].schema._M_str)->_M_dataplus)._M_p;
    in_stack_fffffffffffff6f0.this = (coro_http_client *)puVar10[2].uinfo._M_len;
    in_stack_fffffffffffff6f8 =
         (coro_http_client *)
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&puVar10[2].uinfo._M_str)->_M_allocated_capacity;
    in_stack_fffffffffffff700 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar10[2].host._M_len
    ;
    in_stack_fffffffffffff710 = (allocator<char> *)puVar10[2].port._M_len;
    reconnect(this_05,prVar17,u);
    async_simple::coro::detail::LazyPromiseBase::await_transform<async_simple::coro::Lazy<bool>>
              ((LazyPromiseBase *)in_stack_fffffffffffff6e8,(Lazy<bool> *)in_stack_fffffffffffff6e0)
    ;
    bVar9 = async_simple::coro::detail::LazyAwaiterBase<bool>::await_ready
                      ((LazyAwaiterBase<bool> *)prVar17);
    if (!bVar9) {
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&ctx[9].uinfo)->_M_local_buf[4] = '\x01';
      async_upload_impl(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
      (*(code *)*extraout_RAX)(extraout_RAX);
      return (Lazy<cinatra::resp_data>)in_RDI.__handle_;
    }
    puVar10[7].fragment._M_len = (size_t)prVar17;
    local_3c9 = async_simple::coro::detail::LazyAwaiterBase<bool>::awaitResume
                          ((LazyAwaiterBase<bool> *)in_stack_fffffffffffff6e0);
    async_simple::coro::detail::LazyBase<bool,_false>::ValueAwaiter::~ValueAwaiter
              ((ValueAwaiter *)0x6908bf);
    async_simple::coro::Lazy<bool>::~Lazy((Lazy<bool> *)0x6908cc);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&puVar10[9].uinfo)->_M_local_buf[7] = local_3c9 & 1;
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&puVar10[9].uinfo)->_M_local_buf[7] & 1U) == 0) {
      async_simple::coro::detail::LazyPromise<cinatra::resp_data>::return_value<cinatra::resp_data>
                (in_stack_fffffffffffff6e0,(resp_data *)value);
      local_7cc = 3;
    }
    else {
      local_7cc = 0;
    }
    if (local_7cc == 0) goto LAB_0069098c;
    local_7dc = local_7cc;
  }
  else {
LAB_0069098c:
    local_3e8 = *(undefined8 *)((pointer)ctx[9].schema._M_len + 0xfd8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff720,(char *)in_stack_fffffffffffff718,in_stack_fffffffffffff710
              );
    timer_guard::timer_guard
              (in_stack_fffffffffffff748,in_stack_fffffffffffff740,in_stack_fffffffffffff750,
               in_stack_fffffffffffff738);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff6e0);
    std::allocator<char>::~allocator(local_409);
    sVar16 = (string_view)
             asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff6e0);
    puVar10[7].query = sVar16;
    async_write<asio::mutable_buffers_1>
              (in_stack_fffffffffffff6f8,(mutable_buffers_1 *)in_stack_fffffffffffff6f0.this);
    async_simple::coro::detail::LazyPromiseBase::
    await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
              ((LazyPromiseBase *)in_stack_fffffffffffff6e8,
               (Lazy<std::pair<std::error_code,_unsigned_long>_> *)in_stack_fffffffffffff6e0);
    bVar9 = async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>
            ::await_ready((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)this_01);
    if (!bVar9) {
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&ctx[9].uinfo)->_M_local_buf[4] = '\x02';
      async_upload_impl(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
      (*(code *)*extraout_RAX_00)(extraout_RAX_00);
      return (Lazy<cinatra::resp_data>)in_RDI.__handle_;
    }
    puVar10[7].fragment._M_str = (char *)this_01;
    async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
    awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                in_stack_fffffffffffff700);
    std::tie<std::error_code,unsigned_long>
              (&in_stack_fffffffffffff6e8->net_err,(unsigned_long *)in_stack_fffffffffffff6e0);
    local_460 = std::tuple<std::error_code&,unsigned_long&>::operator=
                          ((tuple<std::error_code_&,_unsigned_long_&> *)
                           in_stack_fffffffffffff6f0.this,
                           (pair<std::error_code,_unsigned_long> *)in_stack_fffffffffffff6e8);
    async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
    ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x690c78);
    async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
              ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x690c85);
    bVar9 = std::error_code::operator_cast_to_bool((error_code *)this_00);
    if (bVar9) {
      handle_upload_timeout_error
                (in_stack_fffffffffffff6f0.this,&in_stack_fffffffffffff6e8->net_err);
      local_498 = (coro_file *)this_00->_M_len;
      local_490 = puVar10[7].host._M_str;
      local_488 = 0x194;
      local_484 = 0;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(abStack_480);
      std::span<cinatra::http_header,_18446744073709551615UL>::span
                ((span<cinatra::http_header,_18446744073709551615UL> *)0x690d31);
      async_simple::coro::detail::LazyPromise<cinatra::resp_data>::return_value<cinatra::resp_data>
                (in_stack_fffffffffffff6e0,(resp_data *)value);
    }
    else {
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&puVar10[9].uinfo)->_M_local_buf[8] = '\x01';
      send_fstream_with_chunked<std::shared_ptr<std::ifstream>>
                (this_04,(shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         source_00,ec);
      async_simple::coro::detail::LazyPromiseBase::await_transform<async_simple::coro::Lazy<void>>
                ((LazyPromiseBase *)in_stack_fffffffffffff6e8,
                 (Lazy<void> *)in_stack_fffffffffffff6e0);
      bVar9 = async_simple::coro::detail::LazyAwaiterBase<void>::await_ready
                        ((LazyAwaiterBase<void> *)this_02);
      if (!bVar9) {
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&ctx[9].uinfo)->_M_local_buf[4] = '\x03';
        async_upload_impl(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
        (*(code *)*extraout_RAX_01)(extraout_RAX_01);
        return (Lazy<cinatra::resp_data>)in_RDI.__handle_;
      }
      *(char ***)&puVar10[7].is_ssl = this_02;
      async_simple::coro::detail::LazyAwaiterBase<void>::awaitResume
                ((LazyAwaiterBase<void> *)in_stack_fffffffffffff6e0);
      async_simple::coro::detail::LazyBase<void,_false>::ValueAwaiter::~ValueAwaiter
                ((ValueAwaiter *)0x690f1c);
      async_simple::coro::Lazy<void>::~Lazy((Lazy<void> *)0x690f29);
      bVar9 = std::error_code::operator_cast_to_bool((error_code *)this_00);
      if (bVar9) {
        handle_upload_timeout_error
                  (in_stack_fffffffffffff6f0.this,&in_stack_fffffffffffff6e8->net_err);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(abStack_4d0);
        std::span<cinatra::http_header,_18446744073709551615UL>::span
                  ((span<cinatra::http_header,_18446744073709551615UL> *)0x690fd5);
        async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
        return_value<cinatra::resp_data>(in_stack_fffffffffffff6e0,(resp_data *)value);
      }
      else {
        req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_stack_fffffffffffff6e0,
                      (req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)value);
        prVar17 = (resp_data *)CONCAT44((int)((ulong)value >> 0x20),3);
        handle_read<std::__cxx11::string>
                  (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
                   in_stack_00000050,in_stack_000000e0);
        async_simple::coro::detail::LazyPromiseBase::
        await_transform<async_simple::coro::Lazy<cinatra::resp_data>>
                  ((LazyPromiseBase *)in_stack_fffffffffffff6e8,
                   (Lazy<cinatra::resp_data> *)in_stack_fffffffffffff6e0);
        bVar9 = async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::await_ready
                          ((LazyAwaiterBase<cinatra::resp_data> *)this_03);
        if (!bVar9) {
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&ctx[9].uinfo)->_M_local_buf[4] = '\x04';
          async_upload_impl(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
          (*(code *)*extraout_RAX_02)(extraout_RAX_02);
          return (Lazy<cinatra::resp_data>)in_RDI.__handle_;
        }
        puVar10[8].schema._M_len = (size_t)this_03;
        async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::awaitResume
                  ((LazyAwaiterBase<cinatra::resp_data> *)in_stack_fffffffffffff720);
        memcpy(&puVar10[4].query._M_str,&puVar10[5].query,0x38);
        async_simple::coro::detail::LazyBase<cinatra::resp_data,_false>::ValueAwaiter::~ValueAwaiter
                  ((ValueAwaiter *)0x691213);
        async_simple::coro::Lazy<cinatra::resp_data>::~Lazy((Lazy<cinatra::resp_data> *)0x691220);
        req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff6e0);
        bVar9 = std::error_code::operator_cast_to_bool((error_code *)this_00);
        if (bVar9) {
          handle_upload_timeout_error
                    (in_stack_fffffffffffff6f0.this,&in_stack_fffffffffffff6e8->net_err);
        }
        eVar15._M_cat = (error_category *)in_stack_fffffffffffff700;
        eVar15._0_8_ = in_stack_fffffffffffff6f8;
        handle_result(in_stack_fffffffffffff6f0.this,in_stack_fffffffffffff6e8,eVar15,
                      SUB81((ulong)in_stack_fffffffffffff6e0 >> 0x38,0));
        async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
        return_value<cinatra::resp_data>(in_stack_fffffffffffff6e0,prVar17);
      }
    }
    timer_guard::~timer_guard((timer_guard *)in_stack_fffffffffffff6f0.this);
    local_7dc = 3;
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6e0);
  local_778 = local_7dc;
LAB_006913f1:
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x69140c);
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff6e0);
  if (local_778 == 3) {
    async_simple::coro::detail::LazyPromiseBase::final_suspend(this_06);
    bVar9 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                      ((FinalAwaiter *)
                       (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&puVar10[9].uinfo)->_M_local_buf + 9));
    if (!bVar9) {
      (ctx->schema)._M_len = 0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&ctx[9].uinfo)->_M_local_buf[4] = '\x05';
      async_upload_impl(in_stack_fffffffffffff6f0.this,in_stack_fffffffffffff6e8);
      (*(code *)*extraout_RAX_03)(extraout_RAX_03);
      return (Lazy<cinatra::resp_data>)in_RDI.__handle_;
    }
    async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
              ((FinalAwaiter *)
               (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&puVar10[9].uinfo)->_M_local_buf + 9));
  }
  async_simple::coro::detail::LazyPromise<cinatra::resp_data>::~LazyPromise
            ((LazyPromise<cinatra::resp_data> *)0x6915d8);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x6915e5);
  std::shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_>::~shared_ptr
            ((shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> *)0x6915f2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6e0);
  if (ctx != (uri_t *)0x0) {
    operator_delete(ctx,0x458);
  }
  return (Lazy<cinatra::resp_data>)in_RDI.__handle_;
}

Assistant:

async_simple::coro::Lazy<resp_data> async_upload_impl(
      S uri, http_method method, Source source /* file */,
      req_content_type content_type = req_content_type::text,
      std::unordered_map<std::string, std::string> headers = {},
      uint64_t offset = 0 /*file offset*/,
      int64_t content_length = -1 /*upload size*/) {
    std::error_code ec{};
    size_t size = 0;
    bool is_keep_alive = true;
    req_context<> ctx{content_type};
    resp_data data{};

    out_buf_ = {};

    std::shared_ptr<void> guard(nullptr, [&, this](auto) {
      if (!req_headers_.empty()) {
        req_headers_.clear();
      }
    });

    auto [ok, u] = handle_uri(data, uri);
    if (!ok) {
      co_return resp_data{std::make_error_code(std::errc::protocol_error), 404};
    }

    if constexpr (upload_type != upload_type_t::multipart) {
      check_source(data, source);
      if (data.status != 0) {
        co_return data;
      }
    }

    if constexpr (upload_type == upload_type_t::with_length) {
      content_length = handle_upload_header_with_length(data, source, headers,
                                                        offset, content_length);
      if (data.status != 0) {
        co_return data;
      }
    }
    else if constexpr (upload_type == upload_type_t::chunked) {
      handle_upload_header_with_chunked(headers);
    }
    else if constexpr (upload_type == upload_type_t::multipart) {
      handle_upload_header_with_multipart();
    }

    std::string header_str =
        build_request_header(u, method, ctx, true, std::move(headers));

    if (socket_->has_closed_) {
      if (bool r = co_await reconnect(data, u); !r) {
        co_return data;
      }
    }

    auto time_guard = timer_guard(this, req_timeout_duration_, "request timer");
    std::tie(ec, size) = co_await async_write(asio::buffer(header_str));
    if (ec) {
      handle_upload_timeout_error(ec);
      co_return resp_data{ec, 404};
    }

    constexpr bool is_stream_file = is_stream_ptr_v<Source>;
    if constexpr (is_stream_file) {
      if constexpr (upload_type == upload_type_t::with_length) {
        co_await send_fstream_with_length(source, ec, offset, content_length);
      }
      else if constexpr (upload_type == upload_type_t::chunked) {
        co_await send_fstream_with_chunked(source, ec);
      }
    }
    else if constexpr (std::is_enum_v<Source>) {  // only for multipart
      co_await send_fstream_with_multipart(ec);
    }
    else if constexpr (std::is_same_v<Source, std::string> ||
                       std::is_same_v<Source, std::string_view>) {
#ifdef __linux__
#ifdef CINATRA_ENABLE_SSL
      if (!has_init_ssl_) {
#endif
        if constexpr (upload_type == upload_type_t::with_length) {
          co_await send_file_no_copy_with_length(std::filesystem::path{source},
                                                 ec, content_length, offset);
        }
        else if constexpr (upload_type == upload_type_t::chunked) {
          co_await send_file_no_copy_with_chunked(std::filesystem::path{source},
                                                  ec);
        }
#ifdef CINATRA_ENABLE_SSL
      }
      else {
        if constexpr (upload_type == upload_type_t::with_length) {
          co_await send_file_copy_with_length(source, ec, content_length,
                                              offset);
        }
        else if constexpr (upload_type == upload_type_t::chunked) {
          co_await send_file_copy_with_chunked(source, ec);
        }
      }
#endif
#else
      if constexpr (upload_type == upload_type_t::with_length) {
        co_await send_file_copy_with_length(source, ec, content_length, offset);
      }
      else if constexpr (upload_type == upload_type_t::chunked) {
        co_await send_file_copy_with_chunked(source, ec);
      }
#endif
    }
    else {
      if constexpr (upload_type == upload_type_t::with_length) {
        co_await send_sink_with_length(source, ec, content_length);
      }
      else if constexpr (upload_type == upload_type_t::chunked) {
        co_await send_sink_with_chunked(source, ec);
      }
    }
    if (ec) {
      handle_upload_timeout_error(ec);
      co_return resp_data{ec, 404};
    }

    data = co_await handle_read(ec, size, is_keep_alive, std::move(ctx),
                                http_method::POST);
    if (ec) {
      handle_upload_timeout_error(ec);
    }
    handle_result(data, ec, is_keep_alive);
    co_return data;
  }